

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_extreme_key_test(void)

{
  ulong uVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar5;
  size_t sVar6;
  uint uVar4;
  size_t sVar7;
  fdb_config *pfVar8;
  long lVar9;
  fdb_config *doc_00;
  fdb_iterator **doc_01;
  fdb_doc **doc_02;
  char *pcVar10;
  fdb_kvs_handle *doc_03;
  fdb_iterator *doc_04;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_doc **unaff_R14;
  ulong uVar11;
  void *__s1;
  char *unaff_R15;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char value [256];
  char key [256];
  char valueBuf [256];
  char keyBuf [256];
  char cmd [256];
  fdb_kvs_handle *pfStack_16f0;
  uint uStack_16e4;
  ulong uStack_16e0;
  fdb_iterator *pfStack_16d8;
  fdb_file_handle *pfStack_16d0;
  fdb_doc **ppfStack_16c8;
  fdb_doc *pfStack_16c0;
  fdb_kvs_info fStack_16b8;
  timeval tStack_1688;
  fdb_kvs_config fStack_1678;
  char acStack_1660 [256];
  fdb_doc *apfStack_1560 [101];
  fdb_config fStack_1238;
  char acStack_1140 [256];
  char acStack_1040 [264];
  fdb_iterator **ppfStack_f38;
  char *pcStack_f30;
  ulong uStack_f28;
  char *pcStack_f20;
  long lStack_f18;
  fdb_doc **ppfStack_f10;
  fdb_iterator *pfStack_ef8;
  fdb_kvs_handle *pfStack_ef0;
  fdb_iterator *pfStack_ee8;
  fdb_file_handle *pfStack_ee0;
  fdb_doc *apfStack_ed8 [10];
  timeval tStack_e88;
  fdb_kvs_config fStack_e78;
  fdb_config fStack_e60;
  char acStack_d68 [256];
  char acStack_c68 [264];
  fdb_config *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  void *pvStack_b48;
  char *pcStack_b40;
  code *pcStack_b38;
  fdb_iterator *pfStack_b28;
  fdb_config *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_file_handle *pfStack_b08;
  bool bStack_afc;
  fdb_kvs_config fStack_af8;
  undefined1 auStack_ae0 [64];
  char acStack_aa0 [256];
  fdb_config fStack_9a0;
  char acStack_8a0 [256];
  fdb_config fStack_7a0;
  fdb_config *pfStack_6a8;
  fdb_kvs_handle *pfStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_doc **ppfStack_690;
  char *pcStack_688;
  fdb_kvs_handle *local_670;
  undefined1 local_668 [24];
  fdb_kvs_config local_650;
  timeval local_638;
  fdb_kvs_handle local_628;
  fdb_config local_420;
  wal_item local_328 [2];
  kvs_ops_stat local_228 [4];
  char local_128 [256];
  
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  local_668._0_8_ = (fdb_kvs_handle *)0x0;
  builtin_strncpy(local_128,"rm -rf  iterator_test*",0x17);
  system(local_128);
  memleak_start();
  pfVar8 = &local_420;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  doc_03 = (fdb_kvs_handle *)(local_668 + 0x10);
  fVar2 = fdb_open((fdb_file_handle **)doc_03,"./iterator_test",pfVar8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011572f;
  doc_03 = (fdb_kvs_handle *)local_668._16_8_;
  fVar2 = fdb_kvs_open((fdb_file_handle *)local_668._16_8_,(fdb_kvs_handle **)(local_668 + 8),
                       (char *)0x0,&local_650);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115734;
  pfVar8 = (fdb_config *)&local_628.config.encryption_key;
  memset(pfVar8,0xff,0x100);
  uVar11 = 1;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  do {
    sprintf((char *)unaff_R12,"0xff length %d",uVar11 & 0xffffffff);
    unaff_R13 = (fdb_kvs_handle *)local_668._8_8_;
    sVar5 = strlen((char *)unaff_R12);
    fdb_set_kv(unaff_R13,pfVar8,uVar11,unaff_R12,sVar5 + 1);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x1e);
  fdb_commit((fdb_file_handle *)local_668._16_8_,'\x01');
  doc_03 = (fdb_kvs_handle *)local_668;
  fVar2 = fdb_doc_create((fdb_doc **)doc_03,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  unaff_R14 = (fdb_doc **)0x1e;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115739;
  *(kvs_ops_stat **)(local_668._0_8_ + 0x20) = local_228;
  *(btree **)(local_668._0_8_ + 0x38) = (btree *)0x0;
  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree =
       (btree *)local_328;
  doc_03 = (fdb_kvs_handle *)local_668._8_8_;
  fVar2 = fdb_iterator_init((fdb_kvs_handle *)local_668._8_8_,(fdb_iterator **)&local_670,
                            (void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011573e;
  doc_03 = local_670;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_670);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115743;
  pfVar8 = (fdb_config *)0x1d;
  do {
    fVar2 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf((char *)&local_628,"0xff length %d",pfVar8);
    unaff_R13 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree
    ;
    iVar3 = bcmp(unaff_R13,&local_628,(size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param)
    ;
    if (iVar3 != 0) {
      iterator_extreme_key_test();
      goto LAB_00115708;
    }
    fVar2 = fdb_iterator_prev((fdb_iterator *)local_670);
    pfVar8 = (fdb_config *)(ulong)((int)pfVar8 - 1);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  fVar2 = fdb_iterator_seek((fdb_iterator *)local_670,&local_628.config.encryption_key,8,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar8 = (fdb_config *)0x8;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      sprintf((char *)&local_628,"0xff length %d",pfVar8);
      unaff_R13 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->
                  seqtree;
      iVar3 = bcmp(unaff_R13,&local_628,
                   (size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
      if (iVar3 != 0) goto LAB_00115715;
      fVar2 = fdb_iterator_prev((fdb_iterator *)local_670);
      pfVar8 = (fdb_config *)(ulong)((int)pfVar8 - 1);
    } while (fVar2 == FDB_RESULT_SUCCESS);
  }
  fVar2 = fdb_iterator_seek((fdb_iterator *)local_670,&local_628.config.encryption_key,8,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar8 = (fdb_config *)0x8;
    do {
      fVar2 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      sprintf((char *)&local_628,"0xff length %d",pfVar8);
      unaff_R13 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->
                  seqtree;
      iVar3 = bcmp(unaff_R13,&local_628,
                   (size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
      if (iVar3 != 0) goto LAB_00115722;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_670);
      pfVar8 = (fdb_config *)(ulong)((int)pfVar8 + 1);
    } while (fVar2 == FDB_RESULT_SUCCESS);
  }
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R12 = &local_628;
  unaff_R15 = "0xff length %d";
  doc_03 = local_670;
  fVar2 = fdb_iterator_close((fdb_iterator *)local_670);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115748;
  fVar2 = fdb_iterator_init((fdb_kvs_handle *)local_668._8_8_,(fdb_iterator **)&local_670,
                            (void *)0x0,0,&local_628.config.encryption_key,0x100,0);
  doc_03 = (fdb_kvs_handle *)local_668._8_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011574d;
  doc_03 = local_670;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_670);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115752;
  pfVar8 = (fdb_config *)0x1d;
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  do {
    fVar2 = fdb_iterator_get((fdb_iterator *)local_670,unaff_R14);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf((char *)unaff_R12,"0xff length %d",pfVar8);
    unaff_R13 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree
    ;
    iVar3 = bcmp(unaff_R13,unaff_R12,(size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
    if (iVar3 != 0) goto LAB_00115708;
    fVar2 = fdb_iterator_prev((fdb_iterator *)local_670);
    pfVar8 = (fdb_config *)(ulong)((int)pfVar8 - 1);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  fVar2 = fdb_iterator_close((fdb_iterator *)local_670);
  doc_03 = local_670;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115757;
  fVar2 = fdb_close((fdb_file_handle *)local_668._16_8_);
  doc_03 = (fdb_kvs_handle *)local_668._16_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011575c;
  *(kvs_ops_stat **)(local_668._0_8_ + 0x20) = (kvs_ops_stat *)0x0;
  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree =
       (btree *)0x0;
  doc_03 = (fdb_kvs_handle *)local_668._0_8_;
  fVar2 = fdb_doc_free((fdb_doc *)local_668._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115761;
  fVar2 = fdb_shutdown();
  if (fVar2 == FDB_RESULT_SUCCESS) {
    memleak_end();
    pcVar10 = "%s PASSED\n";
    if (iterator_extreme_key_test()::__test_pass != '\0') {
      pcVar10 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar10,"iterator extreme key test");
    return;
  }
  goto LAB_00115766;
LAB_00115708:
  iterator_extreme_key_test();
LAB_00115715:
  iterator_extreme_key_test();
LAB_00115722:
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  doc_03 = unaff_R12;
  iterator_extreme_key_test();
LAB_0011572f:
  iterator_extreme_key_test();
LAB_00115734:
  iterator_extreme_key_test();
LAB_00115739:
  iterator_extreme_key_test();
LAB_0011573e:
  iterator_extreme_key_test();
LAB_00115743:
  iterator_extreme_key_test();
LAB_00115748:
  iterator_extreme_key_test();
LAB_0011574d:
  iterator_extreme_key_test();
LAB_00115752:
  iterator_extreme_key_test();
LAB_00115757:
  iterator_extreme_key_test();
LAB_0011575c:
  iterator_extreme_key_test();
LAB_00115761:
  iterator_extreme_key_test();
LAB_00115766:
  iterator_extreme_key_test();
  sVar5 = (ulong)doc_03 & 0xffffffff;
  __s1 = (void *)0x0;
  pcStack_b38 = (code *)0x115790;
  pfStack_6a8 = pfVar8;
  pfStack_6a0 = unaff_R12;
  pfStack_698 = unaff_R13;
  ppfStack_690 = unaff_R14;
  pcStack_688 = unaff_R15;
  gettimeofday((timeval *)(auStack_ae0 + 0x30),(__timezone_ptr_t)0x0);
  pcStack_b38 = (code *)0x115795;
  memleak_start();
  pfStack_b20 = (fdb_config *)0x0;
  pcStack_b38 = (code *)0x1157a6;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar8 = &fStack_7a0;
  pcStack_b38 = (code *)0x1157b6;
  fdb_get_default_config();
  pcStack_b38 = (code *)0x1157c0;
  fdb_get_default_kvs_config();
  fStack_7a0.buffercache_size = 0;
  fStack_7a0.wal_threshold = 0x400;
  fStack_7a0.flags = 1;
  fStack_7a0.compaction_threshold = '\0';
  pcStack_b38 = (code *)0x1157eb;
  fVar2 = fdb_open(&pfStack_b08,"./iterator_test1",pfVar8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    _bStack_afc = SUB84(doc_03,0);
    pcStack_b38 = (code *)0x11580b;
    fVar2 = fdb_kvs_open_default(pfStack_b08,&pfStack_b10,&fStack_af8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c00;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    uVar11 = 0;
    do {
      pcStack_b38 = (code *)0x115836;
      sprintf(acStack_8a0,"%c2",(ulong)((int)uVar11 + 0x61));
      pcStack_b38 = (code *)0x11584f;
      sprintf((char *)&fStack_9a0,"meta%d",uVar11 & 0xffffffff);
      pcStack_b38 = (code *)0x115868;
      sprintf(acStack_aa0,"body%d",uVar11 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(auStack_ae0 + (long)unaff_R13);
      pcStack_b38 = (code *)0x115878;
      sVar5 = strlen(acStack_8a0);
      pfVar8 = &fStack_9a0;
      pcStack_b38 = (code *)0x11588b;
      unaff_R15 = (char *)strlen((char *)pfVar8);
      pcStack_b38 = (code *)0x11589b;
      sVar6 = strlen(acStack_aa0);
      pcStack_b38 = (code *)0x1158c0;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_8a0,sVar5,pfVar8,(size_t)unaff_R15,acStack_aa0,
                     sVar6);
      pcStack_b38 = (code *)0x1158cf;
      fdb_set(pfStack_b10,*(fdb_doc **)(auStack_ae0 + uVar11 * 8));
      uVar11 = uVar11 + 1;
      unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
    } while (uVar11 != 5);
    pcStack_b38 = (code *)0x1158ef;
    fdb_commit(pfStack_b08,bStack_afc);
    pcStack_b38 = (code *)0x115905;
    fVar2 = fdb_snapshot_open(pfStack_b10,&pfStack_b18,0xffffffffffffffff);
    __s1 = (void *)0x5;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c05;
    pcStack_b38 = (code *)0x115925;
    fVar2 = fdb_set_log_callback(pfStack_b10,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c0a;
    pfVar8 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x11595f;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar8,"b2",2,"d2",2,0xe);
    pcStack_b38 = (code *)0x115978;
    fVar2 = fdb_iterator_seek(pfStack_b28,"c1",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c0f;
    pcStack_b38 = (code *)0x115999;
    fVar2 = fdb_iterator_seek(pfStack_b28,"c3",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c14;
    pfVar8 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x1159af;
    fdb_iterator_close(pfStack_b28);
    pcStack_b38 = (code *)0x1159dc;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar8,"b3",2,"d1",2,0xe);
    pcStack_b38 = (code *)0x1159f5;
    fVar2 = fdb_iterator_seek(pfStack_b28,"c1",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c19;
    pcStack_b38 = (code *)0x115a16;
    fVar2 = fdb_iterator_seek(pfStack_b28,"c3",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c1e;
    pfVar8 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x115a2c;
    fdb_iterator_close(pfStack_b28);
    pcStack_b38 = (code *)0x115a59;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar8,"b0",2,"e2",2,0xe);
    pcStack_b38 = (code *)0x115a61;
    fVar2 = fdb_iterator_seek_to_max(pfStack_b28);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c23;
    pcStack_b38 = (code *)0x115a78;
    fVar2 = fdb_iterator_get(pfStack_b28,(fdb_doc **)&pfStack_b20);
    doc_00 = pfStack_b20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c28;
    sVar6._0_2_ = pfStack_b20->chunksize;
    sVar6._2_2_ = *(undefined2 *)&pfStack_b20->field_0x2;
    sVar6._4_4_ = pfStack_b20->blocksize;
    __s1 = *(void **)&pfStack_b20->seqtree_opt;
    pcStack_b38 = (code *)0x115a9b;
    iVar3 = bcmp(__s1,"d2",sVar6);
    if (iVar3 != 0) goto LAB_00115c2d;
    pcStack_b38 = (code *)0x115aab;
    fdb_doc_free((fdb_doc *)doc_00);
    pfStack_b20 = (fdb_config *)0x0;
    pcStack_b38 = (code *)0x115acc;
    fVar2 = fdb_iterator_seek(pfStack_b28,"e2",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c35;
    pcStack_b38 = (code *)0x115adf;
    fVar2 = fdb_iterator_seek_to_min(pfStack_b28);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c3a;
    pcStack_b38 = (code *)0x115af6;
    fVar2 = fdb_iterator_get(pfStack_b28,(fdb_doc **)&pfStack_b20);
    pfVar8 = pfStack_b20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c3f;
    sVar7._0_2_ = pfStack_b20->chunksize;
    sVar7._2_2_ = *(undefined2 *)&pfStack_b20->field_0x2;
    sVar7._4_4_ = pfStack_b20->blocksize;
    __s1 = *(void **)&pfStack_b20->seqtree_opt;
    pcStack_b38 = (code *)0x115b19;
    iVar3 = bcmp(__s1,"c2",sVar7);
    if (iVar3 != 0) goto LAB_00115c44;
    pcStack_b38 = (code *)0x115b29;
    fdb_doc_free((fdb_doc *)pfVar8);
    pcStack_b38 = (code *)0x115b44;
    fVar2 = fdb_iterator_seek(pfStack_b28,"b0",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c4c;
    pcStack_b38 = (code *)0x115b68;
    fVar2 = fdb_iterator_seek(pfStack_b28,"b0",2,'\x01');
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      pcStack_b38 = (code *)0x115b7b;
      fdb_iterator_close(pfStack_b28);
      pcStack_b38 = (code *)0x115b85;
      fdb_kvs_close(pfStack_b10);
      pcStack_b38 = (code *)0x115b8f;
      fdb_kvs_close(pfStack_b18);
      pcStack_b38 = (code *)0x115b99;
      fdb_close(pfStack_b08);
      lVar9 = 0;
      do {
        pcStack_b38 = (code *)0x115ba5;
        fdb_doc_free(*(fdb_doc **)(auStack_ae0 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      pcStack_b38 = (code *)0x115bb3;
      fdb_shutdown();
      pcStack_b38 = (code *)0x115bb8;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pcStack_b38 = (code *)0x115be9;
      fprintf(_stderr,pcVar10,"in-memory snapshot seek test");
      return;
    }
  }
  else {
    pcStack_b38 = (code *)0x115c00;
    iterator_inmem_snapshot_seek_test();
LAB_00115c00:
    pcStack_b38 = (code *)0x115c05;
    iterator_inmem_snapshot_seek_test();
LAB_00115c05:
    pcStack_b38 = (code *)0x115c0a;
    iterator_inmem_snapshot_seek_test();
LAB_00115c0a:
    pcStack_b38 = (code *)0x115c0f;
    iterator_inmem_snapshot_seek_test();
LAB_00115c0f:
    pcStack_b38 = (code *)0x115c14;
    iterator_inmem_snapshot_seek_test();
LAB_00115c14:
    pcStack_b38 = (code *)0x115c19;
    iterator_inmem_snapshot_seek_test();
LAB_00115c19:
    pcStack_b38 = (code *)0x115c1e;
    iterator_inmem_snapshot_seek_test();
LAB_00115c1e:
    pcStack_b38 = (code *)0x115c23;
    iterator_inmem_snapshot_seek_test();
LAB_00115c23:
    pcStack_b38 = (code *)0x115c28;
    iterator_inmem_snapshot_seek_test();
LAB_00115c28:
    doc_00 = pfVar8;
    pcStack_b38 = (code *)0x115c2d;
    iterator_inmem_snapshot_seek_test();
LAB_00115c2d:
    pcStack_b38 = (code *)0x115c35;
    iterator_inmem_snapshot_seek_test();
LAB_00115c35:
    pcStack_b38 = (code *)0x115c3a;
    iterator_inmem_snapshot_seek_test();
LAB_00115c3a:
    pcStack_b38 = (code *)0x115c3f;
    iterator_inmem_snapshot_seek_test();
LAB_00115c3f:
    pfVar8 = doc_00;
    pcStack_b38 = (code *)0x115c44;
    iterator_inmem_snapshot_seek_test();
LAB_00115c44:
    pcStack_b38 = (code *)0x115c4c;
    iterator_inmem_snapshot_seek_test();
LAB_00115c4c:
    pcStack_b38 = (code *)0x115c51;
    iterator_inmem_snapshot_seek_test();
  }
  pcStack_b38 = iterator_no_deletes_test;
  iterator_inmem_snapshot_seek_test();
  ppfStack_f10 = (fdb_doc **)0x115c76;
  pfStack_b60 = pfVar8;
  pfStack_b58 = unaff_R12;
  pfStack_b50 = unaff_R13;
  pvStack_b48 = __s1;
  pcStack_b40 = unaff_R15;
  pcStack_b38 = (code *)sVar5;
  gettimeofday(&tStack_e88,(__timezone_ptr_t)0x0);
  ppfStack_f10 = (fdb_doc **)0x115c7b;
  memleak_start();
  pfStack_ef8 = (fdb_iterator *)0x0;
  ppfStack_f10 = (fdb_doc **)0x115c90;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_f10 = (fdb_doc **)0x115ca0;
  fdb_get_default_config();
  ppfStack_f10 = (fdb_doc **)0x115cb0;
  fdb_get_default_kvs_config();
  fStack_e60.wal_threshold = 0x400;
  fStack_e60.flags = 1;
  fStack_e60.compaction_threshold = '\0';
  ppfStack_f10 = (fdb_doc **)0x115cda;
  fdb_open(&pfStack_ee0,"./iterator_test",&fStack_e60);
  ppfStack_f10 = (fdb_doc **)0x115cf1;
  fdb_kvs_open(pfStack_ee0,&pfStack_ef0,"all_docs",&fStack_e78);
  lVar9 = 0;
  uVar11 = 0;
  do {
    ppfStack_f10 = (fdb_doc **)0x115d1b;
    sprintf(acStack_c68,"key%d",uVar11 & 0xffffffff);
    ppfStack_f10 = (fdb_doc **)0x115d2f;
    sprintf(acStack_d68,"body%d",uVar11 & 0xffffffff);
    doc_02 = (fdb_doc **)((long)apfStack_ed8 + lVar9);
    ppfStack_f10 = (fdb_doc **)0x115d3f;
    sVar5 = strlen(acStack_c68);
    ppfStack_f10 = (fdb_doc **)0x115d4a;
    sVar6 = strlen(acStack_d68);
    ppfStack_f10 = (fdb_doc **)0x115d64;
    fdb_doc_create(doc_02,acStack_c68,sVar5,(void *)0x0,0,acStack_d68,sVar6);
    ppfStack_f10 = (fdb_doc **)0x115d73;
    fdb_set(pfStack_ef0,apfStack_ed8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 8;
  } while (uVar11 != 10);
  doc_01 = (fdb_iterator **)0x0;
  do {
    ppfStack_f10 = (fdb_doc **)0x115d98;
    fVar2 = fdb_del_kv(pfStack_ef0,apfStack_ed8[(long)doc_01]->key,
                       apfStack_ed8[(long)doc_01]->keylen);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_f10 = (fdb_doc **)0x115f06;
      iterator_no_deletes_test();
      goto LAB_00115f06;
    }
    doc_01 = (fdb_iterator **)((long)doc_01 + 1);
  } while (doc_01 != (fdb_iterator **)0xa);
  ppfStack_f10 = (fdb_doc **)0x115db5;
  fdb_commit(pfStack_ee0,'\0');
  ppfStack_f10 = (fdb_doc **)0x115dc4;
  fVar2 = fdb_set(pfStack_ef0,apfStack_ed8[2]);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    doc_01 = &pfStack_ef8;
    ppfStack_f10 = (fdb_doc **)0x115df5;
    fdb_doc_create((fdb_doc **)doc_01,apfStack_ed8[2]->key,apfStack_ed8[2]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_f10 = (fdb_doc **)0x115e02;
    fVar2 = fdb_get(pfStack_ef0,(fdb_doc *)pfStack_ef8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115f0b;
    doc_04 = pfStack_ef8;
    if (*(bool *)&pfStack_ef8->start_key != false) {
      doc_01 = &pfStack_ee8;
      ppfStack_f10 = (fdb_doc **)0x115e27;
      iterator_no_deletes_test();
      doc_04 = pfStack_ee8;
    }
    ppfStack_f10 = (fdb_doc **)0x115e2f;
    fdb_doc_free((fdb_doc *)doc_04);
    pfStack_ef8 = (fdb_iterator *)0x0;
    ppfStack_f10 = (fdb_doc **)0x115e58;
    fVar2 = fdb_iterator_init(pfStack_ef0,&pfStack_ee8,(void *)0x0,0,(void *)0x0,0,2);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfStack_f10 = (fdb_doc **)0x115e6f;
      fVar2 = fdb_iterator_get(pfStack_ee8,(fdb_doc **)&pfStack_ef8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        ppfStack_f10 = (fdb_doc **)0x115e81;
        fdb_doc_free((fdb_doc *)pfStack_ef8);
        ppfStack_f10 = (fdb_doc **)0x115e8b;
        fdb_iterator_close(pfStack_ee8);
        lVar9 = 0;
        do {
          ppfStack_f10 = (fdb_doc **)0x115e97;
          fdb_doc_free(apfStack_ed8[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 10);
        ppfStack_f10 = (fdb_doc **)0x115eaa;
        fdb_kvs_close(pfStack_ef0);
        ppfStack_f10 = (fdb_doc **)0x115eb4;
        fdb_close(pfStack_ee0);
        ppfStack_f10 = (fdb_doc **)0x115eb9;
        fdb_shutdown();
        ppfStack_f10 = (fdb_doc **)0x115ebe;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (iterator_no_deletes_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        ppfStack_f10 = (fdb_doc **)0x115eef;
        fprintf(_stderr,pcVar10,"iterator no deletes test");
        return;
      }
      goto LAB_00115f15;
    }
  }
  else {
LAB_00115f06:
    ppfStack_f10 = (fdb_doc **)0x115f0b;
    iterator_no_deletes_test();
LAB_00115f0b:
    ppfStack_f10 = (fdb_doc **)0x115f10;
    iterator_no_deletes_test();
  }
  ppfStack_f10 = (fdb_doc **)0x115f15;
  iterator_no_deletes_test();
LAB_00115f15:
  ppfStack_f10 = (fdb_doc **)iterator_set_del_docs_test;
  iterator_no_deletes_test();
  ppfStack_f38 = doc_01;
  pcStack_f30 = acStack_d68;
  uStack_f28 = uVar11;
  pcStack_f20 = acStack_c68;
  lStack_f18 = lVar9;
  ppfStack_f10 = doc_02;
  gettimeofday(&tStack_1688,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fStack_1238.wal_threshold = 0x400;
  fStack_1238.flags = 1;
  fStack_1238.compaction_threshold = '\n';
  fStack_1238.purging_interval = 1;
  fdb_open(&pfStack_16d0,"./iterator_test1",&fStack_1238);
  fdb_kvs_open(pfStack_16d0,&pfStack_16f0,"kv1",&fStack_1678);
  uStack_16e0 = 0;
  uVar4 = 0;
  do {
    lVar9 = 0;
    uVar11 = 0;
    uStack_16e4 = uVar4;
    do {
      uVar4 = uStack_16e4;
      sprintf(acStack_1040,"key%02d%03d",(ulong)uStack_16e4,uVar11 & 0xffffffff);
      sprintf(acStack_1140,"meta%02d%03d",(ulong)uVar4,uVar11 & 0xffffffff);
      sprintf(acStack_1660,"body%02d%03d",(ulong)uVar4,uVar11 & 0xffffffff);
      ppfStack_16c8 = (fdb_doc **)((long)apfStack_1560 + lVar9);
      sVar5 = strlen(acStack_1040);
      sVar6 = strlen(acStack_1140);
      sVar7 = strlen(acStack_1660);
      fdb_doc_create(ppfStack_16c8,acStack_1040,sVar5,acStack_1140,sVar6,acStack_1660,sVar7);
      fdb_set(pfStack_16f0,apfStack_1560[uVar11]);
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar11 != 100);
    fdb_commit(pfStack_16d0,'\x01');
    lVar9 = 0;
    do {
      fdb_del(pfStack_16f0,apfStack_1560[lVar9 + 0x19]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x19);
    uVar11 = uStack_16e0 + 0x4b;
    fdb_commit(pfStack_16d0,'\x01');
    fdb_get_kvs_info(pfStack_16f0,&fStack_16b8);
    uStack_16e0 = uVar11;
    if (fStack_16b8.doc_count != uVar11) {
      uVar11 = 0;
      fdb_iterator_init(pfStack_16f0,&pfStack_16d8,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(pfStack_16d8,&pfStack_16c0);
        uVar11 = (ulong)((int)uVar11 + (pfStack_16c0->deleted ^ 1));
        fdb_doc_free(pfStack_16c0);
        fVar2 = fdb_iterator_next(pfStack_16d8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(pfStack_16d8);
      uVar1 = uStack_16e0;
      printf("dbdocs(%d) expected(%d)\n",uVar11,uStack_16e0 & 0xffffffff);
      if (fStack_16b8.doc_count != uVar1) {
        iterator_set_del_docs_test();
      }
    }
    lVar9 = 0;
    do {
      fdb_doc_free(apfStack_1560[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 100);
    uVar4 = uStack_16e4 + 1;
  } while (uVar4 != 0x14);
  fdb_kvs_close(pfStack_16f0);
  fdb_close(pfStack_16d0);
  fdb_shutdown();
  memleak_end();
  pcVar10 = "%s PASSED\n";
  if (iterator_set_del_docs_test()::__test_pass != '\0') {
    pcVar10 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar10,"iterator set del docs");
  return;
}

Assistant:

void iterator_extreme_key_test()
{
    TEST_INIT();

    int n = 30;
    int i, r, c;
    char cmd[256];
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc = NULL;
    fdb_iterator *fit;
    fdb_status s;

    sprintf(cmd, SHELL_DEL " iterator_test*");
    r = system(cmd);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    s = fdb_open(&dbfile, "./iterator_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(key, 0xff, 256);
    for (i=1;i<n;i+=1){
        sprintf(value, "0xff length %d", (int)i);
        fdb_set_kv(db, key, i, value, strlen(value)+1);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // Pre-allocate iterator return document memory and re-use the same
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->meta = NULL;
    doc->body = &valueBuf[0];

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_next(fit);
        c++;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Initialize iterator to an extreme non-existent end_key
    s = fdb_iterator_init(db, &fit, NULL, 0, key, 256, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Release pre-allocated iterator return document buffer space
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();
    TEST_RESULT("iterator extreme key test");
}